

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::deactivate(timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *this,timer_object_holder<timertt::thread_safety::safe> *timer)

{
  reference_counter_type *prVar1;
  size_t *psVar2;
  timer_type *ptVar3;
  timer_type *ptVar4;
  timer_type *ptVar5;
  timer_type **pptVar6;
  pointer pwVar7;
  
  ptVar5 = timer_object_holder<timertt::thread_safety::safe>::
           cast_to<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                     (timer);
  if (*(int *)&(ptVar5->super_timer_object<timertt::thread_safety::safe>).field_0xc == 1) {
    ptVar3 = ptVar5->m_prev;
    ptVar4 = ptVar5->m_next;
    if (ptVar3 == (timer_type *)0x0) {
      pwVar7 = (this->m_wheel).
               super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
               ._M_impl.super__Vector_impl_data._M_start + ptVar5->m_position;
    }
    else {
      pwVar7 = (pointer)&ptVar3->m_next;
    }
    pwVar7->m_head = ptVar4;
    if (ptVar4 == (timer_type *)0x0) {
      pptVar6 = &(this->m_wheel).
                 super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
                 ._M_impl.super__Vector_impl_data._M_start[ptVar5->m_position].m_tail;
    }
    else {
      pptVar6 = &ptVar4->m_prev;
    }
    *pptVar6 = ptVar3;
    LOCK();
    *(undefined4 *)&(ptVar5->super_timer_object<timertt::thread_safety::safe>).field_0xc = 0;
    UNLOCK();
    psVar2 = &(this->
              super_engine_common<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              ).m_timer_quantities.m_single_shot_count + (ptVar5->m_period != 0);
    *psVar2 = *psVar2 - 1;
    LOCK();
    prVar1 = &(ptVar5->super_timer_object<timertt::thread_safety::safe>).m_references;
    (prVar1->super___atomic_base<unsigned_int>)._M_i =
         (prVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((prVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
      (*(ptVar5->super_timer_object<timertt::thread_safety::safe>)._vptr_timer_object[1])(ptVar5);
      return;
    }
  }
  else if (*(int *)&(ptVar5->super_timer_object<timertt::thread_safety::safe>).field_0xc == 2) {
    LOCK();
    *(undefined4 *)&(ptVar5->super_timer_object<timertt::thread_safety::safe>).field_0xc = 3;
    UNLOCK();
  }
  return;
}

Assistant:

void
	deactivate( timer_object_holder< THREAD_SAFETY > timer )
	{
		auto wheel_timer = timer.template cast_to< timer_type >();
		if( timer_status::active == wheel_timer->m_status )
		{
			// This is normal active timer. It can be safely
			// deactivated and destroyed.
			remove_timer_from_wheel( wheel_timer );

			wheel_timer->m_status = timer_status::deactivated;

			// Release timer object.
			this->dec_timer_count( wheel_timer->kind() );
			timer_object< THREAD_SAFETY >::decrement_references( wheel_timer );
		}
		else if( timer_status::wait_for_execution == wheel_timer->m_status )
		{
			// This timer is in execution list right now.
			// We can only changed its status.
			// Final deactivation will be done after execution of
			// timers actions.
			wheel_timer->m_status = timer_status::wait_for_deactivation;
		}
	}